

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O0

int __thiscall
TPZFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontNonSym<std::complex<double>_>_>
::Subst_Backward(TPZFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontNonSym<std::complex<double>_>_>
                 *this,TPZFMatrix<std::complex<double>_> *b)

{
  long in_RDI;
  DecomposeType dec;
  DecomposeType in_stack_00005204;
  TPZFMatrix<std::complex<double>_> *in_stack_00005208;
  TPZFileEqnStorage<std::complex<double>_> *in_stack_00005210;
  
  std::operator<<((ostream *)&std::cout,"Entering Backward Substitution\n");
  std::ostream::flush();
  TPZFront<std::complex<double>_>::GetDecomposeType
            ((TPZFront<std::complex<double>_> *)(in_RDI + 0xd8));
  TPZFileEqnStorage<std::complex<double>_>::Backward
            (in_stack_00005210,in_stack_00005208,in_stack_00005204);
  return 1;
}

Assistant:

int TPZFrontMatrix<TVar,store, front>::Subst_Backward(TPZFMatrix<TVar> *b) const {
	cout << "Entering Backward Substitution\n";
	cout.flush();
	DecomposeType dec = fFront.GetDecomposeType();
//	if(dec != ECholesky) cout << "TPZFrontMatrix::Subst_Forward non matching decomposition\n";
	fStorage.Backward(*b, dec);
	return 1;
}